

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O2

int __thiscall CJSON::IsUTF8(CJSON *this,uchar c)

{
  int iVar1;
  byte bVar2;
  
  bVar2 = ~c;
  if ((bVar2 & 0xf0) == 0) {
    iVar1 = 3;
  }
  else {
    if ((bVar2 & 0xe0) != 0) {
      return (int)((bVar2 & 0xc0) == 0);
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

inline int IsUTF8(unsigned char c)
        {
            if((c & 0xF0) == 0xF0)
                return 3;
            if((c & 0xE0) == 0xE0)
                return 2;
            if((c & 0xC0) == 0xC0)
                return 1;

            return 0;
        }